

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O2

Reals __thiscall Omega_h::repeat_symm<1>(Omega_h *this,LO n,Tensor<1> symm)

{
  Reals RVar1;
  
  RVar1 = repeat_vector<1>(this,n,(Vector<1>)
                                  symm.super_Few<Omega_h::Vector<1>,_1>.array_[0].
                                  super_Few<double,_1>.array_[0]);
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals repeat_symm(LO const n, Tensor<dim> const symm) {
  return repeat_vector(n, symm2vector(symm));
}